

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::
GetJavaClassFullName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,ClassNameResolver *this,string_view name_without_package,
          EnumDescriptor *descriptor,bool immutable,bool kotlin)

{
  FileDescriptor *file;
  bool bVar1;
  undefined7 in_register_00000089;
  size_type sVar2;
  string_view s;
  FixedMapping replacements;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char local_50 [8];
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  sVar2 = CONCAT71(in_register_00000089,immutable);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  file = descriptor->file_;
  bVar1 = NestedInFileClass(descriptor,immutable);
  if (bVar1) {
    GetClassName_abi_cxx11_(&local_78,this,file,immutable,kotlin);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    GetFileJavaPackage_abi_cxx11_(&local_78,this,file,false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  local_50[0] = '\x01';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  local_48 = ".";
  local_40 = 1;
  local_38 = "$";
  s._M_str = local_50;
  s._M_len = (size_t)name_without_package._M_str;
  replacements._M_len = sVar2;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (&local_78,(lts_20250127 *)name_without_package._M_len,s,replacements);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetJavaClassFullName(
    absl::string_view name_without_package, const Descriptor& descriptor,
    bool immutable, bool kotlin) {
  std::string result;
  auto file = descriptor.file();
  if (NestedInFileClass(descriptor, immutable)) {
    result = GetClassName(file, immutable, kotlin);
    if (!result.empty()) result += '$';
  } else {
    result = GetFileJavaPackage(file, immutable);
    if (!result.empty()) result += '.';
  }
  result += absl::StrReplaceAll(name_without_package, {{".", "$"}});
  return result;
}